

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall
wasm::PrintExpressionContents::visitMemoryGrow(PrintExpressionContents *this,MemoryGrow *curr)

{
  ostream *o;
  Module *in_R8;
  Name name;
  string_view local_28;
  MemoryGrow *local_18;
  MemoryGrow *curr_local;
  PrintExpressionContents *this_local;
  
  o = this->o;
  local_18 = curr;
  curr_local = (MemoryGrow *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,"memory.grow");
  printMedium(o,local_28);
  name.super_IString.str._M_str = (char *)this->o;
  name.super_IString.str._M_len = (size_t)(local_18->memory).super_IString.str._M_str;
  anon_unknown_0::printMemoryName
            ((anon_unknown_0 *)(local_18->memory).super_IString.str._M_len,name,
             (ostream *)this->wasm,in_R8);
  return;
}

Assistant:

void visitMemoryGrow(MemoryGrow* curr) {
    printMedium(o, "memory.grow");
    printMemoryName(curr->memory, o, wasm);
  }